

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolitaireTests.cpp
# Opt level: O3

void __thiscall
solitaire::SolitaireEmptyHandTest_tryPullOutCardFromStockPile_Test::TestBody
          (SolitaireEmptyHandTest_tryPullOutCardFromStockPile_Test *this)

{
  StrictSnapshotMockPtr *snapshot;
  FunctionMocker<std::optional<solitaire::cards::Card>_()> *this_00;
  element_type *mock_obj;
  Card CVar1;
  TypedExpectation<std::optional<solitaire::cards::Card>_()> *this_01;
  ActionInterface<std::optional<solitaire::cards::Card>_()> *impl;
  Solitaire *this_02;
  _func_int **message;
  InSequence seq;
  InSequence local_81;
  Card *local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  _Any_data local_70;
  code *local_60;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_50;
  vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> local_38;
  
  testing::InSequence::InSequence(&local_81);
  snapshot = &(this->super_SolitaireEmptyHandTest).snapshotMock;
  SolitaireEmptyHandTest::expectSnapshotCreation<solitaire::piles::StockPileMock>
            (&this->super_SolitaireEmptyHandTest,
             (this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock.
             super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             snapshot);
  mock_obj = (this->super_SolitaireEmptyHandTest).super_SolitaireTest.stockPileMock.
             super___shared_ptr<solitaire::piles::StockPileMock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = &mock_obj->gmock00_tryPullOutCard_15;
  testing::internal::UntypedFunctionMockerBase::RegisterOwner
            (&this_00->super_UntypedFunctionMockerBase,mock_obj);
  local_50.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::MockSpec<std::optional<solitaire::cards::Card>_()>::
            InternalExpectedAt((MockSpec<std::optional<solitaire::cards::Card>_()> *)&local_50,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
                               ,0x164,"*stockPileMock","tryPullOutCard()");
  CVar1 = *(Card *)((anonymous_namespace)::oneCard._8_8_ + -8);
  local_80 = (Card *)operator_new(8);
  *local_80 = CVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<solitaire::cards::Card*>
            (&local_78,local_80);
  impl = (ActionInterface<std::optional<solitaire::cards::Card>_()> *)operator_new(0x20);
  impl->_vptr_ActionInterface = (_func_int **)&PTR__ActionInterface_0031deb0;
  CVar1 = *local_80;
  *(Card *)(impl + 1) = CVar1;
  *(Card *)(impl + 2) = CVar1;
  *(undefined1 *)&impl[3]._vptr_ActionInterface = 1;
  testing::Action<std::optional<solitaire::cards::Card>_()>::Action
            ((Action<std::optional<solitaire::cards::Card>_()> *)&local_70,impl);
  testing::internal::TypedExpectation<std::optional<solitaire::cards::Card>_()>::WillOnce
            (this_01,(Action<std::optional<solitaire::cards::Card>_()> *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,3);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
  }
  SolitaireEmptyHandTest::expectSavingSourcePileSnapshot
            (&this->super_SolitaireEmptyHandTest,snapshot);
  this_02 = &(this->super_SolitaireEmptyHandTest).super_SolitaireTest.solitaire;
  Solitaire::tryPullOutCardFromStockPile(this_02);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_70,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
             (anonymous_namespace)::oneCard);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_38,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_70);
  if ((long *)local_70._M_unused._0_8_ != (long *)0x0) {
    operator_delete(local_70._M_unused._M_object,(long)local_60 - local_70._0_8_);
  }
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            ((vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_70,
             &local_38);
  std::vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>::vector
            (&local_50,
             (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)&local_70);
  if ((long *)local_70._M_unused._0_8_ != (long *)0x0) {
    operator_delete(local_70._M_unused._M_object,(long)local_60 - local_70._0_8_);
  }
  Solitaire::getCardsInHand(this_02);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::vector<solitaire::cards::Card,std::allocator<solitaire::cards::Card>>>>>
  ::operator()(&local_80,(char *)&local_50,
               (vector<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_> *)
               "solitaire.getCardsInHand()");
  if (local_50.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_38.super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.
                    super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.
                          super__Vector_base<solitaire::cards::Card,_std::allocator<solitaire::cards::Card>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((char)local_80 == '\0') {
    testing::Message::Message((Message *)&local_70);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int **)0x298cf7;
    }
    else {
      message = (_func_int **)((_Alloc_hider *)&(local_78._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/SolitaireTests.cpp"
               ,0x168,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((long *)local_70._M_unused._0_8_ != (long *)0x0) {
      (**(code **)(*local_70._M_unused._M_object + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78._M_pi
                );
  }
  testing::InSequence::~InSequence(&local_81);
  return;
}

Assistant:

TEST_F(SolitaireEmptyHandTest, tryPullOutCardFromStockPile) {
    InSequence seq;
    expectSnapshotCreation(*stockPileMock, snapshotMock);
    EXPECT_CALL(*stockPileMock, tryPullOutCard()).WillOnce(Return(oneCard.back()));
    expectSavingSourcePileSnapshot(snapshotMock);

    solitaire.tryPullOutCardFromStockPile();
    EXPECT_THAT(solitaire.getCardsInHand(), ContainerEq(oneCard));
}